

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_quantization_attribute_encoder.cc
# Opt level: O1

bool __thiscall
draco::SequentialQuantizationAttributeEncoder::PrepareValues
          (SequentialQuantizationAttributeEncoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,int num_points)

{
  PointAttribute *__ptr;
  _Head_base<0UL,_draco::PointAttribute_*,_false> _Var1;
  bool bVar2;
  pointer __p;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> portable_attribute;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_30;
  PointAttribute *local_28;
  
  AttributeTransform::InitTransformedAttribute
            ((AttributeTransform *)&local_30,
             (PointAttribute *)&this->attribute_quantization_transform_,
             (int)(this->super_SequentialIntegerAttributeEncoder).super_SequentialAttributeEncoder.
                  attribute_);
  bVar2 = AttributeQuantizationTransform::TransformAttribute
                    (&this->attribute_quantization_transform_,
                     (this->super_SequentialIntegerAttributeEncoder).
                     super_SequentialAttributeEncoder.attribute_,point_ids,local_30._M_head_impl);
  _Var1._M_head_impl = local_30._M_head_impl;
  if (bVar2) {
    local_30._M_head_impl = (PointAttribute *)0x0;
    local_28 = (PointAttribute *)0x0;
    __ptr = (this->super_SequentialIntegerAttributeEncoder).super_SequentialAttributeEncoder.
            portable_attribute_._M_t.
            super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
    (this->super_SequentialIntegerAttributeEncoder).super_SequentialAttributeEncoder.
    portable_attribute_._M_t.
    super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>._M_t.
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
    super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl = _Var1._M_head_impl;
    if (__ptr != (PointAttribute *)0x0) {
      std::default_delete<draco::PointAttribute>::operator()
                ((default_delete<draco::PointAttribute> *)
                 &(this->super_SequentialIntegerAttributeEncoder).super_SequentialAttributeEncoder.
                  portable_attribute_,__ptr);
    }
    if (local_28 != (PointAttribute *)0x0) {
      std::default_delete<draco::PointAttribute>::operator()
                ((default_delete<draco::PointAttribute> *)&local_28,local_28);
    }
    local_28 = (PointAttribute *)0x0;
  }
  if (local_30._M_head_impl != (PointAttribute *)0x0) {
    std::default_delete<draco::PointAttribute>::operator()
              ((default_delete<draco::PointAttribute> *)&local_30,local_30._M_head_impl);
  }
  return bVar2;
}

Assistant:

bool SequentialQuantizationAttributeEncoder::PrepareValues(
    const std::vector<PointIndex> &point_ids, int num_points) {
  auto portable_attribute =
      attribute_quantization_transform_.InitTransformedAttribute(
          *attribute(), point_ids.size());
  if (!attribute_quantization_transform_.TransformAttribute(
          *(attribute()), point_ids, portable_attribute.get())) {
    return false;
  }
  SetPortableAttribute(std::move(portable_attribute));
  return true;
}